

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

int bip39_get_wordlist(char *lang,words **output)

{
  int iVar1;
  ulong local_28;
  size_t i;
  words **output_local;
  char *lang_local;
  
  if (output == (words **)0x0) {
    lang_local._4_4_ = -2;
  }
  else {
    *output = &en_words;
    if (lang != (char *)0x0) {
      for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
        iVar1 = strcmp(lang,lookup[local_28].name);
        if (iVar1 == 0) {
          *output = lookup[local_28].words;
          break;
        }
      }
    }
    lang_local._4_4_ = 0;
  }
  return lang_local._4_4_;
}

Assistant:

int bip39_get_wordlist(const char *lang, struct words **output)
{
    size_t i;

    if (!output)
        return WALLY_EINVAL;

    *output = (struct words *)&en_words; /* Fallback to English if not found */

    if (lang)
        for (i = 0; i < sizeof(lookup) / sizeof(lookup[0]); ++i)
            if (!strcmp(lang, lookup[i].name)) {
                *output = (struct words *)lookup[i].words;
                break;
            }
    return WALLY_OK;
}